

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::Timeout
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  undefined8 uVar1;
  bool bVar2;
  reference this;
  undefined4 local_34;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  uVar1 = _stdscr;
  bVar2 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::empty(Args);
  if (bVar2) {
    local_34 = -1;
  }
  else {
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::front(Args);
    local_34 = BasicValue::toInt(this);
  }
  wtimeout(uVar1,local_34);
  BasicValue::BasicValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::Timeout(std::list<BasicValue> &Args) {
  ::timeout(Args.empty() ? -1 : Args.front().toInt());
  return BasicValue();
}